

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void cs_impl::fiber::entry(void)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  long *plVar4;
  
  lVar3 = ordinator();
  iVar1 = *(int *)(lVar3 + 0x30);
  plVar4 = (long *)ordinator();
  puVar2 = *(undefined8 **)(*plVar4 + (ulong)(iVar1 - 1) * 8);
  if (puVar2 != (undefined8 *)0x0) {
    std::function<void_()>::operator()((function<void_()> *)(puVar2 + 8));
    *(undefined1 *)(puVar2 + 0xd) = 1;
    lVar3 = ordinator();
    *(undefined4 *)(lVar3 + 0x30) = 0;
    cs::current_process = (undefined *)*puVar2;
    return;
  }
  __assert_fail("routine != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                ,0x14b,"void cs_impl::fiber::entry()");
}

Assistant:

void entry()
		{
			routine_t id = ordinator.current;
			Routine *routine = ordinator.routines[id - 1];
			assert(routine != nullptr);

			routine->func();

			routine->finished = true;
			ordinator.current = 0;

			cs::current_process = routine->this_context;
		}